

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program_types.cpp
# Opt level: O0

uint32 __thiscall Clasp::Asp::RuleTransform::Impl::transformSelect(Impl *this,Atom_t h)

{
  bool bVar1;
  size_type sVar2;
  Weight_t WVar3;
  uint32 uVar4;
  reference pWVar5;
  reference puVar6;
  reference plVar7;
  undefined4 in_ESI;
  LitSpan *in_RDI;
  Span<int> SVar8;
  uint32 end;
  uint32 it;
  wsum_t cw;
  uint32 nRule;
  undefined4 in_stack_ffffffffffffffb0;
  LitSpan *x;
  size_type local_1c;
  long local_18;
  uint32 local_10;
  
  bk_lib::pod_vector<int,_std::allocator<int>_>::clear
            ((pod_vector<int,_std::allocator<int>_> *)(in_RDI + 1));
  local_10 = 0;
  local_18 = 0;
  bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
            ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4));
  local_1c = 0;
  sVar2 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::size
                    ((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_> *)
                     (in_RDI + 2));
  do {
    while (local_18 < (int)(size_type)in_RDI[6].size) {
      pWVar5 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
               operator[]((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>
                           *)(in_RDI + 2),local_1c);
      WVar3 = Potassco::weight(pWVar5);
      local_18 = WVar3 + local_18;
      x = in_RDI + 1;
      pWVar5 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
               operator[]((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>
                           *)(in_RDI + 2),local_1c);
      Potassco::lit(pWVar5);
      bk_lib::pod_vector<int,_std::allocator<int>_>::push_back
                ((pod_vector<int,_std::allocator<int>_> *)in_RDI,(int *)x);
      local_1c = local_1c + 1;
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,(uint *)x);
    }
    SVar8 = Potassco::toSpan<bk_lib::pod_vector<int,std::allocator<int>>>
                      ((pod_vector<int,_std::allocator<int>_> *)
                       CONCAT44(in_ESI,in_stack_ffffffffffffffb0));
    uVar4 = addRule((Impl *)SVar8.size,SVar8.first._4_4_,in_RDI);
    local_10 = uVar4 + local_10;
    do {
      bVar1 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                        ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4));
      if (bVar1) {
        return local_10;
      }
      puVar6 = bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::back
                         ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4));
      local_1c = *puVar6;
      bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
                ((pod_vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 4));
      bk_lib::pod_vector<int,_std::allocator<int>_>::pop_back
                ((pod_vector<int,_std::allocator<int>_> *)(in_RDI + 1));
      pWVar5 = bk_lib::pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>::
               operator[]((pod_vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>
                           *)(in_RDI + 2),local_1c);
      WVar3 = Potassco::weight(pWVar5);
      local_18 = local_18 - WVar3;
      local_1c = local_1c + 1;
      in_stack_ffffffffffffffb0 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
      if (local_1c != sVar2) {
        plVar7 = bk_lib::pod_vector<long,_std::allocator<long>_>::operator[]
                           ((pod_vector<long,_std::allocator<long>_> *)(in_RDI + 3),local_1c);
        in_stack_ffffffffffffffb0 =
             CONCAT13(local_18 + *plVar7 < (long)(int)(size_type)in_RDI[6].size,
                      (int3)in_stack_ffffffffffffffb0);
      }
    } while ((char)((uint)in_stack_ffffffffffffffb0 >> 0x18) != '\0');
  } while( true );
}

Assistant:

uint32 RuleTransform::Impl::transformSelect(Atom_t h) {
	lits_.clear();
	uint32 nRule = 0;
	wsum_t cw = 0;
	assert(sumR_[0] >= bound_ && cw < bound_);
	aux_.clear();
	for (uint32 it = 0, end = (uint32)agg_.size();;) {
		while (cw < bound_) {
			cw += Potassco::weight(agg_[it]);
			lits_.push_back(Potassco::lit(agg_[it]));
			aux_.push_back(it++);
		}
		nRule += addRule(h, Potassco::toSpan(lits_));
		do {
			if (aux_.empty()) { return nRule; }
			it = aux_.back();
			aux_.pop_back();
			lits_.pop_back();
			cw -= Potassco::weight(agg_[it]);
		} while (++it == end || (cw + sumR_[it]) < bound_);
	}
}